

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O2

uint32_t arm_shift(status_register_t *cpsr,shift_type_t type,uint32_t data,uint32_t shift_amount)

{
  uint32_t uVar1;
  
  switch((ulong)type) {
  case 0:
    uVar1 = arm_lsl(cpsr,data,shift_amount);
    return uVar1;
  case 1:
    uVar1 = arm_lsr(cpsr,data,shift_amount);
    return uVar1;
  case 2:
    uVar1 = arm_asr(cpsr,data,shift_amount);
    return uVar1;
  case 3:
    uVar1 = arm_ror(cpsr,data,shift_amount);
    return uVar1;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/shifts.c",
            0x6f);
    fprintf(_stderr,"Unknown shift type: %d\n\x1b[0;m",(ulong)type);
    exit(1);
  }
}

Assistant:

word arm_shift(status_register_t* cpsr, shift_type_t type, word data, word shift_amount) {
    switch (type) {
        case LSL:
            return arm_lsl(cpsr, data, shift_amount);
        case LSR:
            return arm_lsr(cpsr, data, shift_amount);
        case ASR:
            return arm_asr(cpsr, data, shift_amount);
        case ROR:
            return arm_ror(cpsr, data, shift_amount);
        default:
            logfatal("Unknown shift type: %d", type)
    }
}